

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O2

void __thiscall
PlantUmlGenerator::deferralLink
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *stateAlias,
          ScName *eventName)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ScName eventNameShort;
  ScName SStack_48;
  
  removeNamespaces(&SStack_48,eventName);
  bVar1 = ::AbstractGenerator::isHighlighted(&this->super_AbstractGenerator,eventName);
  if (bVar1) {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAlias);
    poVar2 = std::operator<<(poVar2," : * <b>");
    poVar2 = std::operator<<(poVar2,(string *)&SStack_48);
    pcVar3 = "</b>\n";
  }
  else {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAlias);
    poVar2 = std::operator<<(poVar2," : * ");
    poVar2 = std::operator<<(poVar2,(string *)&SStack_48);
    pcVar3 = "\n";
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::string::~string((string *)&SStack_48);
  return;
}

Assistant:

void PlantUmlGenerator::deferralLink(std::ostream &output, std::string &indent,
                                     const ScName &stateAlias, const ScName &eventName)
{
    const ScName eventNameShort = removeNamespaces(eventName);

    if (isHighlighted(eventName)) {
        output << indent << stateAlias << " : * <b>" << eventNameShort << "</b>\n";
    } else {
        output << indent << stateAlias << " : * " << eventNameShort << "\n";
    }
}